

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chorus.cpp
# Opt level: O2

void anon_unknown.dwarf_124ac1::Flanger_getParami(EffectProps *props,ALenum param,int *val)

{
  effect_exception *this;
  
  if (param != 1) {
    if (param != 2) {
      this = (effect_exception *)__cxa_allocate_exception(0x30);
      effect_exception::effect_exception
                (this,0xa002,"Invalid flanger integer property 0x%04x",(ulong)(uint)param);
      __cxa_throw(this,&effect_exception::typeinfo,al::base_exception::~base_exception);
    }
    props = (EffectProps *)&(props->Reverb).Diffusion;
  }
  *val = (int)(props->Reverb).Density;
  return;
}

Assistant:

void Flanger_getParami(const EffectProps *props, ALenum param, int *val)
{
    switch(param)
    {
    case AL_FLANGER_WAVEFORM:
        *val = props->Chorus.Waveform;
        break;

    case AL_FLANGER_PHASE:
        *val = props->Chorus.Phase;
        break;

    default:
        throw effect_exception{AL_INVALID_ENUM, "Invalid flanger integer property 0x%04x", param};
    }
}